

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O1

aom_codec_err_t
aom_codec_encode(aom_codec_ctx_t *ctx,aom_image_t *img,aom_codec_pts_t pts,unsigned_long duration,
                aom_enc_frame_flags_t flags)

{
  aom_codec_err_t aVar1;
  unsigned_short mode;
  
  if ((ctx == (aom_codec_ctx_t *)0x0) || (img != (aom_image_t *)0x0 && duration == 0)) {
LAB_00166232:
    aVar1 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    aVar1 = AOM_CODEC_ERROR;
    if ((ctx->iface == (aom_codec_iface_t *)0x0) ||
       ((ctx->priv == (aom_codec_priv_t *)0x0 ||
        (aVar1 = AOM_CODEC_INCAPABLE, (ctx->iface->caps & 2) == 0)))) goto LAB_00166237;
    if (img == (aom_image_t *)0x0) {
      aVar1 = AOM_CODEC_INVALID_PARAM;
      if (duration >> 0x20 != 0) goto LAB_00166237;
    }
    else {
      if (duration >> 0x20 != 0) goto LAB_00166232;
      aVar1 = AOM_CODEC_INVALID_PARAM;
      if ((((uint)ctx->init_flags >> 0x12 ^ img->fmt >> 0xb) & 1) != 0) goto LAB_00166237;
    }
    aVar1 = (*(ctx->iface->enc).encode)
                      ((aom_codec_alg_priv_t_conflict *)ctx->priv,img,pts,duration,flags);
  }
LAB_00166237:
  if (ctx != (aom_codec_ctx_t *)0x0) {
    ctx->err = aVar1;
  }
  return aVar1;
}

Assistant:

aom_codec_err_t aom_codec_encode(aom_codec_ctx_t *ctx, const aom_image_t *img,
                                 aom_codec_pts_t pts, unsigned long duration,
                                 aom_enc_frame_flags_t flags) {
  aom_codec_err_t res = AOM_CODEC_OK;

  if (!ctx || (img && !duration))
    res = AOM_CODEC_INVALID_PARAM;
  else if (!ctx->iface || !ctx->priv)
    res = AOM_CODEC_ERROR;
  else if (!(ctx->iface->caps & AOM_CODEC_CAP_ENCODER))
    res = AOM_CODEC_INCAPABLE;
  else if (img && ((img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) != 0) !=
                      ((ctx->init_flags & AOM_CODEC_USE_HIGHBITDEPTH) != 0)) {
    res = AOM_CODEC_INVALID_PARAM;
#if ULONG_MAX > UINT32_MAX
  } else if (duration > UINT32_MAX) {
    res = AOM_CODEC_INVALID_PARAM;
#endif
  } else {
    /* Execute in a normalized floating point environment, if the platform
     * requires it.
     */
    FLOATING_POINT_INIT
    res = ctx->iface->enc.encode(get_alg_priv(ctx), img, pts, duration, flags);
    FLOATING_POINT_RESTORE
  }

  return SAVE_STATUS(ctx, res);
}